

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonutils.cpp
# Opt level: O0

json to_json_abi_cxx11_(mat *t)

{
  initializer_list_t init;
  json_value extraout_RDX;
  Mat<double> *in_RSI;
  undefined8 in_RDI;
  json jVar1;
  string base64_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffc80;
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffc90;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffcbf;
  size_t in_stack_fffffffffffffcc0;
  uchar *in_stack_fffffffffffffcc8;
  size_t in_stack_fffffffffffffcf0;
  double *in_stack_fffffffffffffcf8;
  undefined1 **local_2a8;
  undefined1 **local_290;
  undefined8 in_stack_fffffffffffffd78;
  undefined2 uVar3;
  undefined8 **ppuVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffd80;
  undefined8 **ppuVar4;
  iterator in_stack_fffffffffffffd88;
  size_type in_stack_fffffffffffffd90;
  undefined1 **local_260;
  undefined1 **local_248;
  undefined1 *local_1f0 [6];
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 *local_1b0;
  undefined1 *local_1a8 [3];
  undefined1 local_190 [24];
  undefined8 *local_178;
  undefined8 local_170;
  undefined8 *local_168;
  undefined1 *local_160 [3];
  undefined1 local_148 [24];
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 *local_120;
  undefined1 *local_118 [3];
  undefined1 local_100 [24];
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 *local_d8;
  undefined1 *local_d0 [3];
  undefined1 local_b8 [24];
  undefined1 local_a0 [24];
  undefined1 local_88 [24];
  undefined8 *local_70;
  undefined8 local_68;
  string local_50 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30 [2];
  
  uVar3 = (undefined2)((ulong)in_stack_fffffffffffffd78 >> 0x30);
  arma::Mat<double>::size(in_RSI);
  serialize<double>(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x298c79);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_30);
  base64_encode_abi_cxx11_
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,(bool)in_stack_fffffffffffffcbf);
  local_d8 = local_d0;
  local_120 = local_118;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[5],_0>
            (in_stack_fffffffffffffc80,(char (*) [5])in_stack_fffffffffffffc78);
  local_120 = (undefined8 *)local_100;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[4],_0>
            (in_stack_fffffffffffffc80,(char (*) [4])in_stack_fffffffffffffc78);
  local_e8 = local_118;
  local_e0 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
  local_d8 = (undefined8 *)local_b8;
  local_168 = local_160;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[7],_0>
            (in_stack_fffffffffffffc80,(char (*) [7])in_stack_fffffffffffffc78);
  local_168 = (undefined8 *)local_148;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_unsigned_int_&,_0>(in_stack_fffffffffffffc80,(uint *)in_stack_fffffffffffffc78);
  local_130 = local_160;
  local_128 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
  local_d8 = (undefined8 *)local_a0;
  local_1b0 = local_1a8;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[7],_0>
            (in_stack_fffffffffffffc80,(char (*) [7])in_stack_fffffffffffffc78);
  local_1b0 = (undefined8 *)local_190;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_unsigned_int_&,_0>(in_stack_fffffffffffffc80,(uint *)in_stack_fffffffffffffc78);
  local_178 = local_1a8;
  local_170 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
  local_d8 = (undefined8 *)local_88;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<const_char_(&)[12],_0>
            (in_stack_fffffffffffffc80,(char (*) [12])in_stack_fffffffffffffc78);
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  local_1c0 = local_1f0;
  local_1b8 = 2;
  nlohmann::json_abi_v3_11_3::detail::
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  ::json_ref(in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
  local_70 = local_d0;
  local_68 = 4;
  init._M_len = in_stack_fffffffffffffd90;
  init._M_array = in_stack_fffffffffffffd88;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(in_stack_fffffffffffffd80,init,SUB21((ushort)uVar3 >> 8,0),(value_t)uVar3);
  local_248 = (undefined1 **)&local_70;
  do {
    local_248 = local_248 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x298f70);
  } while (local_248 != local_d0);
  local_260 = (undefined1 **)&local_1c0;
  do {
    local_260 = local_260 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x298fc2);
  } while (local_260 != local_1f0);
  ppuVar4 = (undefined8 **)local_1a8;
  ppuVar2 = &local_178;
  do {
    ppuVar2 = ppuVar2 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x299014);
  } while (ppuVar2 != ppuVar4);
  local_290 = (undefined1 **)&local_130;
  do {
    local_290 = local_290 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x299066);
  } while (local_290 != local_160);
  local_2a8 = (undefined1 **)&local_e8;
  do {
    local_2a8 = local_2a8 + -3;
    nlohmann::json_abi_v3_11_3::detail::
    json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
    ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 *)0x2990b8);
  } while (local_2a8 != local_118);
  std::__cxx11::string::~string(local_50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc90);
  jVar1.m_data.m_value.object = extraout_RDX.object;
  jVar1.m_data._0_8_ = in_RDI;
  return (json)jVar1.m_data;
}

Assistant:

LIBKRIGING_EXPORT nlohmann::json to_json(const arma::mat& t) {
  auto data = serialize(t.memptr(), t.size());
  std::string base64_data = base64_encode(data.data(), data.size(), false);
  return {{"type", "mat"}, {"n_rows", t.n_rows}, {"n_cols", t.n_cols}, {"base64_data", base64_data}};
}